

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::texcoord2h>
          (Attribute *this,double t,texcoord2h *dst,TimeSampleInterpolationType tinterp)

{
  half hVar1;
  bool bVar2;
  value_type *pvVar3;
  optional<tinyusdz::value::texcoord2h> local_44;
  optional<tinyusdz::value::texcoord2h> local_3e;
  optional<tinyusdz::value::texcoord2h> v;
  TimeSampleInterpolationType tinterp_local;
  texcoord2h *dst_local;
  double t_local;
  Attribute *this_local;
  
  if (dst == (texcoord2h *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    tinyusdz::value::TimeCode::TimeCode((TimeCode *)&stack0xffffffffffffffc8,t);
    bVar2 = tinyusdz::value::TimeCode::is_default((TimeCode *)&stack0xffffffffffffffc8);
    if ((bVar2) && (bVar2 = has_value(this), bVar2)) {
      primvar::PrimVar::get_value<tinyusdz::value::texcoord2h>(&local_44,&this->_var);
      nonstd::optional_lite::optional<tinyusdz::value::texcoord2h>::
      optional<tinyusdz::value::texcoord2h,_0>(&local_3e,&local_44);
      nonstd::optional_lite::optional<tinyusdz::value::texcoord2h>::~optional(&local_44);
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_3e);
      if (bVar2) {
        pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::texcoord2h>::value(&local_3e);
        hVar1.value = (pvVar3->t).value;
        dst->s = (half)(pvVar3->s).value;
        dst->t = (half)hVar1.value;
        this_local._7_1_ = 1;
      }
      nonstd::optional_lite::optional<tinyusdz::value::texcoord2h>::~optional(&local_3e);
      if (bVar2) goto LAB_007c8ef6;
    }
    bVar2 = has_timesamples(this);
    if (bVar2) {
      this_local._7_1_ =
           primvar::PrimVar::get_interpolated_value<tinyusdz::value::texcoord2h>
                     (&this->_var,t,tinterp,dst);
    }
    else {
      this_local._7_1_ = get_value<tinyusdz::value::texcoord2h>(this,dst);
    }
  }
LAB_007c8ef6:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }